

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

xmlAutomataStatePtr
xmlAutomataNewCountTrans2
          (xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,xmlChar *token,
          xmlChar *token2,int min,int max,void *data)

{
  xmlRegCounter *pxVar1;
  uint counter;
  int iVar2;
  xmlRegAtomPtr atom;
  size_t sVar3;
  size_t sVar4;
  void *__dest;
  xmlChar *pxVar5;
  int iVar6;
  
  if ((min < 0 || token == (xmlChar *)0x0) ||
      (from == (xmlAutomataStatePtr)0x0 || am == (xmlAutomataPtr)0x0)) {
    return (xmlAutomataStatePtr)0x0;
  }
  if (max < 1 || max < min) {
    return (xmlAutomataStatePtr)0x0;
  }
  atom = xmlRegNewAtom(am,XML_REGEXP_STRING);
  if (atom == (xmlRegAtomPtr)0x0) {
    return (xmlAutomataStatePtr)0x0;
  }
  if ((token2 == (xmlChar *)0x0) || (*token2 == '\0')) {
    pxVar5 = xmlStrdup(token);
    atom->valuep = pxVar5;
    if (pxVar5 == (xmlChar *)0x0) goto LAB_0017e7ac;
  }
  else {
    sVar3 = strlen((char *)token2);
    sVar4 = strlen((char *)token);
    iVar2 = (int)sVar4;
    iVar6 = (int)sVar3;
    __dest = (*xmlMalloc)((long)(iVar6 + iVar2 + 2));
    if (__dest == (void *)0x0) goto LAB_0017e7ac;
    memcpy(__dest,token,(long)iVar2);
    *(undefined1 *)((long)__dest + (long)iVar2) = 0x7c;
    memcpy((void *)((long)(iVar2 + 1) + (long)__dest),token2,(long)iVar6);
    *(undefined1 *)((long)__dest + (long)(iVar6 + iVar2) + 1) = 0;
    atom->valuep = __dest;
  }
  atom->data = data;
  atom->min = min + (uint)(min == 0);
  atom->max = max;
  counter = xmlRegGetCounter(am);
  if (-1 < (int)counter) {
    pxVar1 = am->counters;
    pxVar1[counter].min = min;
    pxVar1[counter].max = max;
    if ((to != (xmlAutomataStatePtr)0x0) || (to = xmlRegStatePush(am), to != (xmlRegStatePtr)0x0)) {
      xmlRegStateAddTrans(am,from,atom,to,counter,-1);
      iVar2 = xmlRegAtomPush(am,atom);
      if (-1 < iVar2) {
        am->state = to;
        if (min == 0) {
          xmlRegStateAddTrans(am,from,(xmlRegAtomPtr)0x0,to,-1,-1);
          return to;
        }
        return to;
      }
    }
  }
LAB_0017e7ac:
  xmlRegFreeAtom(atom);
  return (xmlAutomataStatePtr)0x0;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewCountTrans2(xmlAutomataPtr am, xmlAutomataStatePtr from,
			 xmlAutomataStatePtr to, const xmlChar *token,
			 const xmlChar *token2,
			 int min, int max, void *data) {
    xmlRegAtomPtr atom;
    int counter;

    if ((am == NULL) || (from == NULL) || (token == NULL))
	return(NULL);
    if (min < 0)
	return(NULL);
    if ((max < min) || (max < 1))
	return(NULL);
    atom = xmlRegNewAtom(am, XML_REGEXP_STRING);
    if (atom == NULL)
	return(NULL);
    if ((token2 == NULL) || (*token2 == 0)) {
	atom->valuep = xmlStrdup(token);
        if (atom->valuep == NULL)
            goto error;
    } else {
	int lenn, lenp;
	xmlChar *str;

	lenn = strlen((char *) token2);
	lenp = strlen((char *) token);

	str = xmlMalloc(lenn + lenp + 2);
	if (str == NULL)
	    goto error;
	memcpy(&str[0], token, lenp);
	str[lenp] = '|';
	memcpy(&str[lenp + 1], token2, lenn);
	str[lenn + lenp + 1] = 0;

	atom->valuep = str;
    }
    atom->data = data;
    if (min == 0)
	atom->min = 1;
    else
	atom->min = min;
    atom->max = max;

    /*
     * associate a counter to the transition.
     */
    counter = xmlRegGetCounter(am);
    if (counter < 0)
        goto error;
    am->counters[counter].min = min;
    am->counters[counter].max = max;

    /* xmlFAGenerateTransitions(am, from, to, atom); */
    if (to == NULL) {
	to = xmlRegStatePush(am);
        if (to == NULL)
            goto error;
    }
    xmlRegStateAddTrans(am, from, atom, to, counter, -1);
    if (xmlRegAtomPush(am, atom) < 0)
        goto error;
    am->state = to;

    if (to == NULL)
	to = am->state;
    if (to == NULL)
	return(NULL);
    if (min == 0)
	xmlFAGenerateEpsilonTransition(am, from, to);
    return(to);

error:
    xmlRegFreeAtom(atom);
    return(NULL);
}